

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O1

bool children(log_multi *b,uint32_t *current,uint32_t *class_index,uint32_t label)

{
  v_array<node> *this;
  uint32_t *puVar1;
  uint uVar2;
  node *pnVar3;
  uint uVar4;
  size_t sVar5;
  node *pnVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  node node;
  node local_88;
  
  this = &b->nodes;
  local_88.preds._end = (node_pred *)(ulong)label;
  local_88._0_8_ = 0;
  local_88.preds._begin = (node_pred *)0x0;
  sVar5 = v_array<node_pred>::unique_add_sorted
                    (&(b->nodes)._begin[*current].preds,(node_pred *)&local_88);
  *class_index = (uint32_t)sVar5;
  puVar1 = &(b->nodes)._begin[*current].preds._begin[sVar5 & 0xffffffff].label_count;
  *puVar1 = *puVar1 + 1;
  uVar4 = *current;
  pnVar3 = (b->nodes)._begin;
  uVar10 = pnVar3[uVar4].preds._begin[*class_index].label_count;
  if (pnVar3[uVar4].max_count < uVar10) {
    pnVar3[uVar4].max_count = uVar10;
    this->_begin[*current].max_count_label = this->_begin[*current].preds._begin[*class_index].label
    ;
  }
  uVar4 = *current;
  pnVar3 = this->_begin;
  if (pnVar3[uVar4].internal != false) {
    return true;
  }
  if ((ulong)(((long)pnVar3[uVar4].preds._end - (long)pnVar3[uVar4].preds._begin >> 3) *
             -0x5555555555555555) < 2) goto LAB_001f3211;
  if (b->predictors_used < b->max_predictors) {
LAB_001f2ef4:
    uVar11 = (ulong)(uint)((int)((ulong)((long)(b->nodes)._end - (long)pnVar3) >> 3) * -0x45d1745d);
    local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
    local_88.preds._begin = (node_pred *)0x0;
    local_88.preds._end = (node_pred *)0x0;
    local_88.preds.end_array = (node_pred *)0x0;
    local_88.preds.erase_count._0_5_ = 0;
    local_88.preds.erase_count._5_3_ = 0;
    local_88.min_count = 0;
    local_88.internal = false;
    v_array<node_pred>::clear(&local_88.preds);
    local_88.base_predictor = 0;
    local_88.left = 0;
    local_88._60_8_ = 0;
    local_88._68_8_ = 0;
    local_88.max_count = 0;
    local_88.max_count_label = 1;
    local_88.right = 0;
    v_array<node>::push_back(this,&local_88);
    uVar4 = (int)((ulong)((long)(b->nodes)._end - (long)(b->nodes)._begin) >> 3) * -0x45d1745d;
    local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
    local_88.preds._begin = (node_pred *)0x0;
    local_88.preds._end = (node_pred *)0x0;
    local_88.preds.end_array = (node_pred *)0x0;
    local_88.preds.erase_count._0_5_ = 0;
    local_88.preds.erase_count._5_3_ = 0;
    local_88.min_count = 0;
    local_88.internal = false;
    v_array<node_pred>::clear(&local_88.preds);
    local_88.base_predictor = 0;
    local_88.left = 0;
    local_88._60_8_ = 0;
    local_88._68_8_ = 0;
    local_88.max_count = 0;
    local_88.max_count_label = 1;
    local_88.right = 0;
    v_array<node>::push_back(this,&local_88);
    pnVar3 = (b->nodes)._begin;
    sVar5 = b->predictors_used;
    b->predictors_used = sVar5 + 1;
    pnVar3[*current].base_predictor = (uint32_t)sVar5;
  }
  else {
    if (pnVar3[uVar4].min_count - pnVar3[uVar4].max_count <=
        (pnVar3->min_count + 1) * b->swap_resist) goto LAB_001f3211;
    if (b->predictors_used < b->max_predictors) goto LAB_001f2ef4;
    uVar11 = 0;
    pnVar6 = pnVar3;
    if (pnVar3->internal == true) {
      do {
        uVar11 = (ulong)pnVar6->right;
        if (pnVar3[pnVar6->left].min_count < pnVar3[uVar11].min_count) {
          uVar11 = (ulong)pnVar6->left;
        }
        pnVar6 = pnVar3 + uVar11;
      } while (pnVar3[uVar11].internal != false);
    }
    uVar4 = pnVar3[uVar11].parent;
    uVar10 = pnVar3[uVar4].parent;
    if (pnVar3[uVar11].min_count != pnVar3->min_count) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"glargh ",7);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," != ",4);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    b->nbofswaps = b->nbofswaps + 1;
    pnVar3 = (b->nodes)._begin;
    uVar2 = (&pnVar3[uVar4].left)[(uint32_t)uVar11 != pnVar3[uVar4].right];
    if (uVar4 == pnVar3[uVar10].left) {
      pnVar3[uVar10].left = uVar2;
    }
    else {
      pnVar3[uVar10].right = uVar2;
    }
    this->_begin[uVar2].parent = uVar10;
    uVar8 = (ulong)uVar2;
    while ((int)uVar8 != 0) {
      pnVar3 = this->_begin;
      uVar9 = (ulong)pnVar3[uVar8].parent;
      if (pnVar3[uVar9].min_count == pnVar3[uVar8].min_count) break;
      uVar10 = pnVar3[pnVar3[uVar9].left].min_count;
      if (pnVar3[pnVar3[uVar9].right].min_count < pnVar3[pnVar3[uVar9].left].min_count) {
        uVar10 = pnVar3[pnVar3[uVar9].right].min_count;
      }
      pnVar3[uVar9].min_count = uVar10;
      uVar8 = uVar9;
    }
    pnVar3 = this->_begin;
    pnVar3[uVar11].internal = false;
    v_array<node_pred>::clear(&pnVar3[uVar11].preds);
    pnVar3[uVar11].base_predictor = 0;
    pnVar3[uVar11].left = 0;
    *(undefined8 *)&pnVar3[uVar11].norm_Eh = 0;
    *(undefined8 *)((long)&pnVar3[uVar11].Eh + 4) = 0;
    pnVar3[uVar11].max_count = 0;
    pnVar3[uVar11].max_count_label = 1;
    pnVar3[uVar11].right = 0;
    this->_begin[*current].base_predictor = this->_begin[uVar4].base_predictor;
    pnVar3 = this->_begin;
    pnVar3[uVar4].internal = false;
    v_array<node_pred>::clear(&pnVar3[uVar4].preds);
    pnVar3[uVar4].base_predictor = 0;
    pnVar3[uVar4].left = 0;
    *(undefined8 *)&pnVar3[uVar4].norm_Eh = 0;
    *(undefined8 *)((long)&pnVar3[uVar4].Eh + 4) = 0;
    pnVar3[uVar4].max_count = 0;
    pnVar3[uVar4].max_count_label = 1;
    pnVar3[uVar4].right = 0;
  }
  this->_begin[*current].left = (uint32_t)uVar11;
  this->_begin[uVar11].parent = *current;
  this->_begin[*current].right = uVar4;
  this->_begin[uVar4].parent = *current;
  this->_begin[uVar11].min_count = this->_begin[*current].min_count >> 1;
  pnVar3 = this->_begin;
  pnVar3[uVar4].min_count = pnVar3[*current].min_count - pnVar3[uVar11].min_count;
  uVar8 = uVar11;
  while ((int)uVar8 != 0) {
    pnVar3 = this->_begin;
    uVar9 = (ulong)pnVar3[uVar8].parent;
    if (pnVar3[uVar9].min_count == pnVar3[uVar8].min_count) break;
    uVar10 = pnVar3[pnVar3[uVar9].left].min_count;
    if (pnVar3[pnVar3[uVar9].right].min_count < pnVar3[pnVar3[uVar9].left].min_count) {
      uVar10 = pnVar3[pnVar3[uVar9].right].min_count;
    }
    pnVar3[uVar9].min_count = uVar10;
    uVar8 = uVar9;
  }
  this->_begin[uVar11].max_count_label = this->_begin[*current].max_count_label;
  this->_begin[uVar4].max_count_label = this->_begin[*current].max_count_label;
  this->_begin[*current].internal = true;
LAB_001f3211:
  return this->_begin[*current].internal;
}

Assistant:

bool children(log_multi& b, uint32_t& current, uint32_t& class_index, uint32_t label)
{
  class_index = (uint32_t)b.nodes[current].preds.unique_add_sorted(node_pred(label));
  b.nodes[current].preds[class_index].label_count++;

  if (b.nodes[current].preds[class_index].label_count > b.nodes[current].max_count)
  {
    b.nodes[current].max_count = b.nodes[current].preds[class_index].label_count;
    b.nodes[current].max_count_label = b.nodes[current].preds[class_index].label;
  }

  if (b.nodes[current].internal)
    return true;
  else if (b.nodes[current].preds.size() > 1 &&
      (b.predictors_used < b.max_predictors ||
          b.nodes[current].min_count - b.nodes[current].max_count > b.swap_resist * (b.nodes[0].min_count + 1)))
  {
    // need children and we can make them.
    uint32_t left_child;
    uint32_t right_child;
    if (b.predictors_used < b.max_predictors)
    {
      left_child = (uint32_t)b.nodes.size();
      b.nodes.push_back(init_node());
      right_child = (uint32_t)b.nodes.size();
      b.nodes.push_back(init_node());
      b.nodes[current].base_predictor = (uint32_t)b.predictors_used++;
    }
    else
    {
      uint32_t swap_child = find_switch_node(b);
      uint32_t swap_parent = b.nodes[swap_child].parent;
      uint32_t swap_grandparent = b.nodes[swap_parent].parent;
      if (b.nodes[swap_child].min_count != b.nodes[0].min_count)
        cout << "glargh " << b.nodes[swap_child].min_count << " != " << b.nodes[0].min_count << endl;
      b.nbofswaps++;

      uint32_t nonswap_child;
      if (swap_child == b.nodes[swap_parent].right)
        nonswap_child = b.nodes[swap_parent].left;
      else
        nonswap_child = b.nodes[swap_parent].right;

      if (swap_parent == b.nodes[swap_grandparent].left)
        b.nodes[swap_grandparent].left = nonswap_child;
      else
        b.nodes[swap_grandparent].right = nonswap_child;
      b.nodes[nonswap_child].parent = swap_grandparent;
      update_min_count(b, nonswap_child);

      init_leaf(b.nodes[swap_child]);
      left_child = swap_child;
      b.nodes[current].base_predictor = b.nodes[swap_parent].base_predictor;
      init_leaf(b.nodes[swap_parent]);
      right_child = swap_parent;
    }
    b.nodes[current].left = left_child;
    b.nodes[left_child].parent = current;
    b.nodes[current].right = right_child;
    b.nodes[right_child].parent = current;

    b.nodes[left_child].min_count = b.nodes[current].min_count / 2;
    b.nodes[right_child].min_count = b.nodes[current].min_count - b.nodes[left_child].min_count;
    update_min_count(b, left_child);

    b.nodes[left_child].max_count_label = b.nodes[current].max_count_label;
    b.nodes[right_child].max_count_label = b.nodes[current].max_count_label;

    b.nodes[current].internal = true;
  }
  return b.nodes[current].internal;
}